

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O0

void gutil::getFileList(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *list,string *prefix,string *suffix)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  ulong in_RDX;
  string *in_RSI;
  value_type *in_RDI;
  string name;
  dirent *entry;
  DIR *p;
  size_t pos;
  string pref;
  string dir;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  allocator *paVar7;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  dirent *local_f0;
  undefined1 local_e1;
  DIR *local_c0;
  string local_b8 [32];
  string local_98 [32];
  ulong local_78;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  string *local_10;
  value_type *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_70,local_10);
  uVar1 = std::__cxx11::string::find_last_of((char *)local_70,0x128013);
  local_78 = uVar1;
  uVar2 = std::__cxx11::string::size();
  if (uVar1 < uVar2) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_70);
    std::__cxx11::string::operator=(local_38,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_70);
    std::__cxx11::string::operator=(local_70,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    local_c0 = opendir(".");
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_c0 = opendir(pcVar4);
  }
  if (local_c0 == (DIR *)0x0) {
    local_e1 = 1;
    uVar5 = __cxa_allocate_exception(0x28);
    std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    IOException::IOException((IOException *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_e1 = 0;
    __cxa_throw(uVar5,&IOException::typeinfo,IOException::~IOException);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x11b063);
  local_f0 = readdir(local_c0);
  do {
    if (local_f0 == (dirent *)0x0) {
      closedir(local_c0);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_38);
      return;
    }
    pcVar4 = local_f0->d_name;
    paVar7 = &local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar4,paVar7);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    uVar1 = std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    lVar6 = std::__cxx11::string::size();
    if ((ulong)(lVar3 + lVar6) <= uVar1) {
      lVar3 = std::__cxx11::string::find(local_110,(ulong)local_70);
      if (lVar3 == 0) {
        lVar3 = std::__cxx11::string::size();
        if (lVar3 != 0) {
          in_stack_fffffffffffffe58 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::rfind(local_110,local_18);
          in_stack_fffffffffffffe50 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::size();
          lVar3 = std::__cxx11::string::size();
          if (in_stack_fffffffffffffe58 != in_stack_fffffffffffffe50 + -lVar3) goto LAB_0011b284;
        }
        __x = local_8;
        std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe50,__x);
        std::__cxx11::string::~string(local_138);
      }
    }
LAB_0011b284:
    local_f0 = readdir(local_c0);
    std::__cxx11::string::~string(local_110);
  } while( true );
}

Assistant:

void gutil::getFileList(std::set<std::string> &list, const std::string &prefix,
                        const std::string &suffix)
{
#ifdef __GNUC__
  std::string dir="", pref=prefix;
  size_t pos=pref.find_last_of("/\\");

  if (pos < pref.size())
  {
    dir=pref.substr(0, pos+1);
    pref=pref.substr(pos+1);
  }

  DIR *p;

  if (dir.size() > 0)
  {
    p=opendir(dir.c_str());
  }
  else
  {
    p=opendir(".");
  }

  if (p == 0)
  {
    throw IOException("Cannot open directory: "+dir);
  }

  list.clear();

  struct dirent *entry=readdir(p);

  while (entry != 0)
  {
    std::string name=entry->d_name;

    if (name.size() >= pref.size()+suffix.size() &&
        name.find(pref) ==  0 && (suffix.size() == 0 ||
                                  name.rfind(suffix) == name.size()-suffix.size()))
    {
      list.insert(dir+name);
    }

    entry=readdir(p);
  }

  closedir(p);
#elif defined(WIN32)
  std::string dir="";
  size_t pos=prefix.find_last_of("/\\");

  if (pos < prefix.size())
  {
    dir=prefix.substr(0, pos+1);
  }

  HANDLE p;
  WIN32_FIND_DATA data;

  list.clear();

  p=FindFirstFileA((prefix+"*"+suffix).c_str(), &data);

  if (p != INVALID_HANDLE_VALUE)
  {
    do
    {
      list.insert(dir+data.cFileName);
    }
    while (FindNextFileA(p, &data));

    FindClose(p);
  }

#else
  assert(false);
#endif
}